

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma.cpp
# Opt level: O0

bool __thiscall
stream::lzma_decompressor_impl_base::filter
          (lzma_decompressor_impl_base *this,char **begin_in,char *end_in,char **begin_out,
          char *end_out,bool flush)

{
  long *plVar1;
  int iVar2;
  lzma_error *this_00;
  undefined8 uVar3;
  long *in_RCX;
  long in_RDX;
  long *in_RSI;
  long *in_RDI;
  long in_R8;
  byte in_R9B;
  lzma_ret ret;
  lzma_stream *strm;
  undefined8 in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  string *msg;
  lzma_error *in_stack_ffffffffffffff50;
  allocator<char> *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  
  plVar1 = (long *)*in_RDI;
  *plVar1 = *in_RSI;
  plVar1[1] = in_RDX - *in_RSI;
  plVar1[3] = *in_RCX;
  plVar1[4] = in_R8 - *in_RCX;
  iVar2 = lzma_code(plVar1,0);
  if ((((in_R9B & 1) != 0) && (iVar2 == 10)) && (plVar1[4] != 0)) {
    this_00 = (lzma_error *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70
              );
    lzma_error::lzma_error
              (this_00,in_stack_ffffffffffffff48,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
    __cxa_throw(this_00,&lzma_error::typeinfo,slice_error::~slice_error);
  }
  *in_RSI = *plVar1;
  *in_RCX = plVar1[3];
  if (((iVar2 != 0) && (iVar2 != 1)) && (iVar2 != 10)) {
    uVar3 = __cxa_allocate_exception(0x28);
    msg = (string *)&stack0xffffffffffffff67;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70
              );
    lzma_error::lzma_error(in_stack_ffffffffffffff50,msg,(int)((ulong)uVar3 >> 0x20));
    __cxa_throw(uVar3,&lzma_error::typeinfo,slice_error::~slice_error);
  }
  return iVar2 != 1;
}

Assistant:

bool lzma_decompressor_impl_base::filter(const char * & begin_in, const char * end_in,
                                         char * & begin_out, char * end_out, bool flush) {
	
	lzma_stream * strm = static_cast<lzma_stream *>(stream);
	
	strm->next_in = reinterpret_cast<const boost::uint8_t *>(begin_in);
	strm->avail_in = size_t(end_in - begin_in);
	
	strm->next_out = reinterpret_cast<boost::uint8_t *>(begin_out);
	strm->avail_out = size_t(end_out - begin_out);
	
	lzma_ret ret = lzma_code(strm, LZMA_RUN);
	
	if(flush && ret == LZMA_BUF_ERROR && strm->avail_out > 0) {
		throw lzma_error("truncated lzma stream", ret);
	}
	
	begin_in = reinterpret_cast<const char *>(strm->next_in);
	begin_out = reinterpret_cast<char *>(strm->next_out);
	
	if(ret != LZMA_OK && ret != LZMA_STREAM_END && ret != LZMA_BUF_ERROR) {
		throw lzma_error("lzma decrompression error", ret);
	}
	
	return (ret != LZMA_STREAM_END);
}